

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_hc::create_color_selector_codebook_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  endpoint_indices_details *peVar4;
  uint *puVar5;
  color_selector_details *pcVar6;
  selector_indices_details *psVar7;
  vector<crnlib::color_selector_details> *in_RDX;
  long in_RSI;
  long in_RDI;
  uint s_4;
  uint p_3;
  uint (*total_errors) [16] [4];
  uint error;
  uint32 selector;
  uint s_3;
  uint best_error;
  uint best_index;
  uint s_2;
  uint p_2;
  uint s_1;
  uint p_1;
  uint s;
  uint p;
  color_quad_u8 *endpoint_colors;
  color_cluster *cluster;
  uint bEnd;
  uint b;
  uint n;
  uint E8 [4] [256];
  uint E4 [8] [16];
  uint E2 [16] [4];
  uint num_tasks;
  vector<crnlib::color_selector_details> *selector_details;
  undefined1 in_stack_ffffffffffffec2f;
  uint in_stack_ffffffffffffec30;
  undefined2 in_stack_ffffffffffffec34;
  uint16 in_stack_ffffffffffffec36;
  vector<crnlib::dxt_hc::selector_indices_details> *in_stack_ffffffffffffec38;
  undefined1 in_stack_ffffffffffffec43;
  uint local_13a4;
  uint local_1394;
  uint local_1388;
  uint local_1384;
  uint local_136c;
  uint local_1368;
  uint local_1364;
  uint local_1360;
  uint local_135c;
  uint local_1358;
  uint local_1354;
  uint local_1350;
  uint local_134c;
  uint local_1330;
  int local_1328 [256];
  int aiStack_f28 [256];
  int aiStack_b28 [256];
  int aiStack_728 [256];
  int local_328 [128];
  uint local_128 [65];
  uint local_24;
  vector<crnlib::color_selector_details> *local_20;
  long local_10;
  
  local_20 = in_RDX;
  local_10 = in_RSI;
  uVar2 = task_pool::get_num_threads(*(task_pool **)(in_RDI + 0x898));
  local_24 = uVar2 + 1;
  if ((*(byte *)(in_RDI + 0x866) & 1) == 0) {
    local_1394 = *(uint *)(in_RDI + 0x640);
  }
  else {
    local_1394 = *(uint *)(in_RDI + 0x640) >> 1;
  }
  uVar1 = (ulong)local_24;
  for (local_1330 = (uint)(((ulong)local_1394 * local_10) / (ulong)local_24);
      local_1330 < (uint)(((ulong)local_1394 * (local_10 + 1)) / uVar1); local_1330 = local_1330 + 1
      ) {
    peVar4 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                       ((vector<crnlib::dxt_hc::endpoint_indices_details> *)(in_RDI + 0x6e8),
                        local_1330);
    vector<crnlib::dxt_hc::color_cluster>::operator[]
              ((vector<crnlib::dxt_hc::color_cluster> *)(in_RDI + 0x868),
               (uint)(peVar4->field_0).field_0.color);
    for (local_134c = 0; local_134c < 0x10; local_134c = local_134c + 1) {
      for (local_1350 = 0; local_1350 < 4; local_1350 = local_1350 + 1) {
        if ((*(byte *)(in_RDI + 0x866) & 1) == 0) {
          local_13a4 = crnlib::color::color_distance
                                 ((bool)in_stack_ffffffffffffec43,
                                  (color_quad_u8 *)in_stack_ffffffffffffec38,
                                  (color_quad_u8 *)
                                  CONCAT26(in_stack_ffffffffffffec36,
                                           CONCAT24(in_stack_ffffffffffffec34,
                                                    in_stack_ffffffffffffec30)),
                                  (bool)in_stack_ffffffffffffec2f);
        }
        else {
          peVar4 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                             ((vector<crnlib::dxt_hc::endpoint_indices_details> *)(in_RDI + 0x6e8),
                              local_1330 << 1 | local_134c >> 3);
          vector<crnlib::dxt_hc::color_cluster>::operator[]
                    ((vector<crnlib::dxt_hc::color_cluster> *)(in_RDI + 0x868),
                     (uint)(peVar4->field_0).field_0.color);
          local_13a4 = crnlib::color::color_distance
                                 ((bool)in_stack_ffffffffffffec43,
                                  (color_quad_u8 *)in_stack_ffffffffffffec38,
                                  (color_quad_u8 *)
                                  CONCAT26(in_stack_ffffffffffffec36,
                                           CONCAT24(in_stack_ffffffffffffec34,
                                                    in_stack_ffffffffffffec30)),
                                  (bool)in_stack_ffffffffffffec2f);
        }
        local_128[(ulong)local_134c * 4 + (ulong)local_1350] = local_13a4;
      }
    }
    for (local_1354 = 0; local_1354 < 8; local_1354 = local_1354 + 1) {
      for (local_1358 = 0; local_1358 < 0x10; local_1358 = local_1358 + 1) {
        local_328[(ulong)local_1354 * 0x10 + (ulong)local_1358] =
             local_128[(ulong)(local_1354 << 1) * 4 + (ulong)(local_1358 & 3)] +
             local_128[(ulong)(local_1354 << 1 | 1) * 4 + (ulong)(local_1358 >> 2)];
      }
    }
    for (local_135c = 0; local_135c < 4; local_135c = local_135c + 1) {
      for (local_1360 = 0; local_1360 < 0x100; local_1360 = local_1360 + 1) {
        local_1328[(ulong)local_135c * 0x100 + (ulong)local_1360] =
             local_328[(ulong)(local_135c << 1) * 0x10 + (ulong)(local_1360 & 0xf)] +
             local_328[(ulong)(local_135c << 1 | 1) * 0x10 + (ulong)(local_1360 >> 4)];
      }
    }
    local_1364 = 0;
    local_1368 = 0xffffffff;
    for (local_136c = 0;
        uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x698)),
        local_136c < uVar2; local_136c = local_136c + 1) {
      puVar5 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x698),local_136c)
      ;
      uVar3 = *puVar5;
      uVar3 = local_1328[uVar3 & 0xff] + aiStack_f28[uVar3 >> 8 & 0xff] +
              aiStack_b28[uVar3 >> 0x10 & 0xff] + aiStack_728[uVar3 >> 0x18];
      if (uVar3 < local_1368) {
        local_1364 = local_136c;
        local_1368 = uVar3;
      }
    }
    pcVar6 = vector<crnlib::color_selector_details>::operator[](local_20,local_1364);
    for (local_1384 = 0; local_1384 < 0x10; local_1384 = local_1384 + 1) {
      for (local_1388 = 0; local_1388 < 4; local_1388 = local_1388 + 1) {
        pcVar6->error[local_1384][local_1388] =
             local_128[(ulong)local_1384 * 4 + (ulong)local_1388] +
             pcVar6->error[local_1384][local_1388];
      }
    }
    pcVar6 = vector<crnlib::color_selector_details>::operator[](local_20,local_1364);
    pcVar6->used = true;
    in_stack_ffffffffffffec36 = (uint16)local_1364;
    in_stack_ffffffffffffec38 = (vector<crnlib::dxt_hc::selector_indices_details> *)(in_RDI + 0x6f8)
    ;
    in_stack_ffffffffffffec30 = local_1330;
    if ((*(byte *)(in_RDI + 0x866) & 1) != 0) {
      in_stack_ffffffffffffec30 = local_1330 << 1;
    }
    psVar7 = vector<crnlib::dxt_hc::selector_indices_details>::operator[]
                       (in_stack_ffffffffffffec38,in_stack_ffffffffffffec30);
    (psVar7->field_0).field_0.color = in_stack_ffffffffffffec36;
  }
  return;
}

Assistant:

void dxt_hc::create_color_selector_codebook_task(uint64 data, void* pData_ptr) {
  crnlib::vector<color_selector_details>& selector_details = *static_cast<crnlib::vector<color_selector_details>*>(pData_ptr);
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  uint E2[16][4];
  uint E4[8][16];
  uint E8[4][256];
  for (uint n = m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks, b = n * data / num_tasks, bEnd = n * (data + 1) / num_tasks; b < bEnd; b++) {
    color_cluster& cluster = m_color_clusters[m_endpoint_indices[b].color];
    color_quad_u8* endpoint_colors = cluster.color_values;
    for (uint p = 0; p < 16; p++) {
      for (uint s = 0; s < 4; s++)
        E2[p][s] = m_has_subblocks ? color::color_distance(m_params.m_perceptual, m_blocks[b][p], m_color_clusters[m_endpoint_indices[b << 1 | p >> 3].color].color_values[s], false) :
          color::color_distance(m_params.m_perceptual, m_blocks[b][p], endpoint_colors[s], false);
    }
    for (uint p = 0; p < 8; p++) {
      for (uint s = 0; s < 16; s++)
        E4[p][s] = E2[p << 1][s & 3] + E2[p << 1 | 1][s >> 2];
    }
    for (uint p = 0; p < 4; p++) {
      for (uint s = 0; s < 256; s++)
        E8[p][s] = E4[p << 1][s & 15] + E4[p << 1 | 1][s >> 4];
    }
    uint best_index = 0;
    for (uint best_error = cUINT32_MAX, s = 0; s < m_color_selectors.size(); s++) {
      uint32 selector = m_color_selectors[s];
      uint error = E8[0][selector & 255] + E8[1][selector >> 8 & 255] + E8[2][selector >> 16 & 255] + E8[3][selector >> 24 & 255];
      if (error < best_error) {
        best_error = error;
        best_index = s;
      }
    }
    uint (&total_errors)[16][4] = selector_details[best_index].error;
    for (uint p = 0; p < 16; p++) {
      for (uint s = 0; s < 4; s++)
        total_errors[p][s] += E2[p][s];
    }
    selector_details[best_index].used = true;
    m_selector_indices[m_has_subblocks ? b << 1 : b].color = best_index;
  }
}